

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_estimateCCtxSize_usingCCtxParams_internal
                 (ZSTD_compressionParameters *cParams,ldmParams_t *ldmParams,int isStatic,
                 ZSTD_paramSwitch_e useRowMatchFinder,size_t buffInSize,size_t buffOutSize,
                 U64 pledgedSrcSize,int useSequenceProducer,size_t maxBlockSize)

{
  ldmParams_t params;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  undefined8 in_stack_fffffffffffffed0;
  size_t local_128;
  size_t local_120;
  size_t local_110;
  size_t local_f8;
  U64 local_f0;
  ulong local_e8;
  U64 local_e0;
  size_t neededSpace;
  size_t externalSeqSpace;
  size_t maxNbExternalSeq;
  size_t cctxSpace;
  size_t bufferSpace;
  size_t ldmSeqSpace;
  size_t maxNbLdmSeq;
  size_t ldmSpace;
  size_t matchStateSize;
  size_t blockStateSpace;
  size_t entropySpace;
  size_t tokenSpace;
  size_t maxNbSeq;
  size_t blockSize;
  size_t windowSize;
  size_t buffOutSize_local;
  size_t buffInSize_local;
  ZSTD_paramSwitch_e useRowMatchFinder_local;
  int isStatic_local;
  ldmParams_t *ldmParams_local;
  ZSTD_compressionParameters *cParams_local;
  
  if ((ulong)(1L << ((byte)cParams->windowLog & 0x3f)) < pledgedSrcSize) {
    local_e0 = 1L << ((byte)cParams->windowLog & 0x3f);
  }
  else {
    local_e0 = pledgedSrcSize;
  }
  if (local_e0 == 0) {
    local_e8 = 1;
  }
  else {
    if ((ulong)(1L << ((byte)cParams->windowLog & 0x3f)) < pledgedSrcSize) {
      local_f0 = 1L << ((byte)cParams->windowLog & 0x3f);
    }
    else {
      local_f0 = pledgedSrcSize;
    }
    local_e8 = local_f0;
  }
  sVar5 = ZSTD_resolveMaxBlockSize(maxBlockSize);
  if (sVar5 < local_e8) {
    local_f8 = ZSTD_resolveMaxBlockSize(maxBlockSize);
  }
  else {
    local_f8 = local_e8;
  }
  sVar5 = ZSTD_maxNbSeq(local_f8,cParams->minMatch,useSequenceProducer);
  sVar6 = ZSTD_cwksp_alloc_size(local_f8 + 0x20);
  sVar7 = ZSTD_cwksp_aligned_alloc_size(sVar5 << 3);
  sVar5 = ZSTD_cwksp_alloc_size(sVar5);
  sVar8 = ZSTD_cwksp_alloc_size(0x22d8);
  sVar9 = ZSTD_cwksp_alloc_size(0x1600);
  sVar10 = ZSTD_sizeof_matchState(cParams,useRowMatchFinder,0,1);
  uVar1 = ldmParams->bucketSizeLog;
  uVar2 = ldmParams->minMatchLength;
  uVar3 = ldmParams->hashRateLog;
  uVar4 = ldmParams->windowLog;
  params.minMatchLength = uVar4;
  params.bucketSizeLog = uVar3;
  params.hashLog = uVar2;
  params.enableLdm = uVar1;
  params.hashRateLog = (int)in_stack_fffffffffffffed0;
  params.windowLog = (int)((ulong)in_stack_fffffffffffffed0 >> 0x20);
  sVar11 = ZSTD_ldm_getTableSize(params);
  sVar12 = ZSTD_ldm_getMaxNbSeq(*ldmParams,local_f8);
  if (ldmParams->enableLdm == ZSTD_ps_enable) {
    local_110 = ZSTD_cwksp_aligned_alloc_size(sVar12 * 0xc);
  }
  else {
    local_110 = 0;
  }
  sVar12 = ZSTD_cwksp_alloc_size(buffInSize);
  sVar13 = ZSTD_cwksp_alloc_size(buffOutSize);
  if (isStatic == 0) {
    local_120 = 0;
  }
  else {
    local_120 = ZSTD_cwksp_alloc_size(0x1478);
  }
  sVar14 = ZSTD_sequenceBound(local_f8);
  if (useSequenceProducer == 0) {
    local_128 = 0;
  }
  else {
    local_128 = ZSTD_cwksp_aligned_alloc_size(sVar14 << 4);
  }
  return local_120 + sVar8 + sVar9 * 2 + sVar11 + local_110 + sVar10 + sVar6 + sVar7 + sVar5 * 3 +
         sVar12 + sVar13 + local_128;
}

Assistant:

static size_t ZSTD_estimateCCtxSize_usingCCtxParams_internal(
        const ZSTD_compressionParameters* cParams,
        const ldmParams_t* ldmParams,
        const int isStatic,
        const ZSTD_paramSwitch_e useRowMatchFinder,
        const size_t buffInSize,
        const size_t buffOutSize,
        const U64 pledgedSrcSize,
        int useSequenceProducer,
        size_t maxBlockSize)
{
    size_t const windowSize = (size_t) BOUNDED(1ULL, 1ULL << cParams->windowLog, pledgedSrcSize);
    size_t const blockSize = MIN(ZSTD_resolveMaxBlockSize(maxBlockSize), windowSize);
    size_t const maxNbSeq = ZSTD_maxNbSeq(blockSize, cParams->minMatch, useSequenceProducer);
    size_t const tokenSpace = ZSTD_cwksp_alloc_size(WILDCOPY_OVERLENGTH + blockSize)
                            + ZSTD_cwksp_aligned_alloc_size(maxNbSeq * sizeof(seqDef))
                            + 3 * ZSTD_cwksp_alloc_size(maxNbSeq * sizeof(BYTE));
    size_t const entropySpace = ZSTD_cwksp_alloc_size(ENTROPY_WORKSPACE_SIZE);
    size_t const blockStateSpace = 2 * ZSTD_cwksp_alloc_size(sizeof(ZSTD_compressedBlockState_t));
    size_t const matchStateSize = ZSTD_sizeof_matchState(cParams, useRowMatchFinder, /* enableDedicatedDictSearch */ 0, /* forCCtx */ 1);

    size_t const ldmSpace = ZSTD_ldm_getTableSize(*ldmParams);
    size_t const maxNbLdmSeq = ZSTD_ldm_getMaxNbSeq(*ldmParams, blockSize);
    size_t const ldmSeqSpace = ldmParams->enableLdm == ZSTD_ps_enable ?
        ZSTD_cwksp_aligned_alloc_size(maxNbLdmSeq * sizeof(rawSeq)) : 0;


    size_t const bufferSpace = ZSTD_cwksp_alloc_size(buffInSize)
                             + ZSTD_cwksp_alloc_size(buffOutSize);

    size_t const cctxSpace = isStatic ? ZSTD_cwksp_alloc_size(sizeof(ZSTD_CCtx)) : 0;

    size_t const maxNbExternalSeq = ZSTD_sequenceBound(blockSize);
    size_t const externalSeqSpace = useSequenceProducer
        ? ZSTD_cwksp_aligned_alloc_size(maxNbExternalSeq * sizeof(ZSTD_Sequence))
        : 0;

    size_t const neededSpace =
        cctxSpace +
        entropySpace +
        blockStateSpace +
        ldmSpace +
        ldmSeqSpace +
        matchStateSize +
        tokenSpace +
        bufferSpace +
        externalSeqSpace;

    DEBUGLOG(5, "estimate workspace : %u", (U32)neededSpace);
    return neededSpace;
}